

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Mfs_Par_t *pPars;
  uint local_70;
  Mfs_Par_t Pars;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._60_8_ = Abc_FrameReadNtk(pAbc);
  Abc_NtkMfsParsDefault((Mfs_Par_t *)((long)&pPars + 4));
  Extra_UtilGetoptReset();
LAB_0022c96b:
  iVar1 = Extra_UtilGetopt(argc,argv,"WFDMLCdraestpgvwh");
  if (iVar1 == -1) {
    if (Pars._60_8_ == 0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsLogic((Abc_Ntk_t *)Pars._60_8_);
    if (iVar1 == 0) {
      Abc_Print(-1,"This command can only be applied to a logic network.\n");
      return 1;
    }
    iVar1 = Abc_NtkMfs((Abc_Ntk_t *)Pars._60_8_,(Mfs_Par_t *)((long)&pPars + 4));
    if (iVar1 == 0) {
      Abc_Print(-1,"Resynthesis has failed.\n");
      return 1;
    }
    return 0;
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_0022cd99;
    }
    Pars.nWinMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nWinMax;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      goto LAB_0022cd99;
    }
    Pars.nWinTfoLevs = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nWinTfoLevs;
    break;
  default:
    goto LAB_0022cd99;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0022cd99;
    }
    local_70 = atoi(argv[globalUtilOptind]);
    uVar2 = local_70;
    break;
  case 0x4c:
    if (globalUtilOptind < argc) goto LAB_0022cb99;
    Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
    goto LAB_0022cd99;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_0022cd99;
    }
    Pars.nFanoutsMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nFanoutsMax;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_0022cd99;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    uVar2 = pPars._4_4_;
    break;
  case 0x61:
    Pars.fRrOnly = Pars.fRrOnly ^ 1;
    goto LAB_0022c96b;
  case 100:
    Pars.nGrowthLevel = Pars.nGrowthLevel ^ 1;
    goto LAB_0022c96b;
  case 0x65:
    Pars.fResub = Pars.fResub ^ 1;
    goto LAB_0022c96b;
  case 0x67:
    Pars.fDelay = Pars.fDelay ^ 1;
    goto LAB_0022c96b;
  case 0x68:
    goto LAB_0022cd99;
  case 0x70:
    Pars.fOneHotness = Pars.fOneHotness ^ 1;
    goto LAB_0022c96b;
  case 0x72:
    Pars.nBTLimit = Pars.nBTLimit ^ 1;
    goto LAB_0022c96b;
  case 0x73:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_0022c96b;
  case 0x74:
    Pars.fMoreEffort = Pars.fMoreEffort ^ 1;
    goto LAB_0022c96b;
  case 0x76:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_0022c96b;
  case 0x77:
    Pars.fGiaSat = Pars.fGiaSat ^ 1;
    goto LAB_0022c96b;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar2 < 0) {
LAB_0022cd99:
    Abc_Print(-2,"usage: mfs [-WFDMLC <num>] [-draestpgvh]\n");
    Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
    Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
              (ulong)pPars._4_4_);
    Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
              (ulong)local_70);
    Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
              (ulong)(uint)Pars.nWinTfoLevs);
    Abc_Print(-2,
              "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nFanoutsMax);
    Abc_Print(-2,
              "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
              ,(ulong)(uint)Pars.nDepthMax);
    Abc_Print(-2,
              "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nWinMax);
    pcVar3 = "no";
    if (Pars.nGrowthLevel != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar3);
    pcVar3 = "dc-min";
    if (Pars.nBTLimit != 0) {
      pcVar3 = "resub";
    }
    Abc_Print(-2,"\t-r       : toggle resubstitution and dc-minimization [default = %s]\n",pcVar3);
    pcVar3 = "area+edges";
    if (Pars.fRrOnly != 0) {
      pcVar3 = "area";
    }
    Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fResub != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fArea != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-s       : toggle evaluation of edge swapping [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fMoreEffort != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-t       : toggle using artificial one-hotness conditions [default = %s]\n",
              pcVar3);
    pcVar3 = "no";
    if (Pars.fOneHotness != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-p       : toggle power-aware optimization [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fDelay != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-g       : toggle using new SAT solver [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fPower != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fGiaSat != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",pcVar3
             );
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_0022c96b;
LAB_0022cb99:
  Pars.nDepthMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((Pars.nDepthMax < 0) || (1000000000 < Pars.nDepthMax)) goto LAB_0022cd99;
  goto LAB_0022c96b;
}

Assistant:

int Abc_CommandMfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Mfs_Par_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Abc_NtkMfsParsDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCdraestpgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinTfoLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinTfoLevs < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutsMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'r':
            pPars->fResub ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 's':
            pPars->fSwapEdge ^= 1;
            break;
        case 't':
            pPars->fOneHotness ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'g':
            pPars->fGiaSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkMfs( pNtk, pPars ) )
    {
        Abc_Print( -1, "Resynthesis has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: mfs [-WFDMLC <num>] [-draestpgvh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n", pPars->nWinTfoLevs );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n", pPars->nFanoutsMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n", pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n", pPars->nWinMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n", pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle resubstitution and dc-minimization [default = %s]\n", pPars->fResub? "resub": "dc-min" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n", pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n", pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle evaluation of edge swapping [default = %s]\n", pPars->fSwapEdge? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggle using artificial one-hotness conditions [default = %s]\n", pPars->fOneHotness? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggle power-aware optimization [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggle using new SAT solver [default = %s]\n", pPars->fGiaSat? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}